

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginLV2export.cpp
# Opt level: O0

void addAttribute(String *text,char *attribute,char **values,uint indent,bool endInDot)

{
  int iVar1;
  size_t pos;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  char *local_58;
  char *local_50;
  uint local_44;
  uint uStack_40;
  bool isUrl;
  uint j_1;
  uint j;
  uint i;
  size_t attributeLength;
  size_t index;
  bool found;
  bool endInDot_local;
  char **ppcStack_20;
  uint indent_local;
  char **values_local;
  char *attribute_local;
  String *text_local;
  
  index._3_1_ = endInDot;
  index._4_4_ = indent;
  ppcStack_20 = values;
  values_local = (char **)attribute;
  attribute_local = (char *)text;
  if (*values == (char *)0x0) {
    if ((endInDot) &&
       (pos = DISTRHO::String::rfind(text,';',(bool *)((long)&index + 2)), (index._2_1_ & 1) != 0))
    {
      pcVar2 = DISTRHO::String::operator[]((String *)attribute_local,pos);
      *pcVar2 = '.';
    }
  }
  else {
    sVar3 = strlen(attribute);
    for (j_1 = 0; ppcStack_20[j_1] != (char *)0x0; j_1 = j_1 + 1) {
      for (uStack_40 = 0; uStack_40 < index._4_4_; uStack_40 = uStack_40 + 1) {
        DISTRHO::String::operator+=((String *)attribute_local," ");
      }
      if (j_1 == 0) {
        DISTRHO::String::operator+=((String *)attribute_local,(char *)values_local);
      }
      else {
        for (local_44 = 0; local_44 < sVar3; local_44 = local_44 + 1) {
          DISTRHO::String::operator+=((String *)attribute_local," ");
        }
      }
      DISTRHO::String::operator+=((String *)attribute_local," ");
      pcVar2 = strstr(ppcStack_20[j_1],"://");
      bVar4 = true;
      if (pcVar2 == (char *)0x0) {
        iVar1 = strncmp(ppcStack_20[j_1],"urn:",4);
        bVar4 = iVar1 == 0;
      }
      if (bVar4) {
        DISTRHO::String::operator+=((String *)attribute_local,"<");
      }
      DISTRHO::String::operator+=((String *)attribute_local,ppcStack_20[j_1]);
      if (bVar4) {
        DISTRHO::String::operator+=((String *)attribute_local,">");
      }
      if (ppcStack_20[j_1 + 1] == (char *)0x0) {
        if ((index._3_1_ & 1) == 0) {
          local_58 = " ;\n\n";
        }
        else {
          local_58 = " .\n\n";
        }
        local_50 = local_58;
      }
      else {
        local_50 = " ,\n";
      }
      DISTRHO::String::operator+=((String *)attribute_local,local_50);
    }
  }
  return;
}

Assistant:

static void addAttribute(DISTRHO_NAMESPACE::String& text,
                         const char* const attribute,
                         const char* const values[],
                         const uint indent,
                         const bool endInDot = false)
{
    if (values[0] == nullptr)
    {
        if (endInDot)
        {
            bool found;
            const size_t index = text.rfind(';', &found);
            if (found) text[index] = '.';
        }
        return;
    }

    const size_t attributeLength = std::strlen(attribute);

    for (uint i = 0; values[i] != nullptr; ++i)
    {
        for (uint j = 0; j < indent; ++j)
            text += " ";

        if (i == 0)
        {
            text += attribute;
        }
        else
        {
            for (uint j = 0; j < attributeLength; ++j)
                text += " ";
        }

        text += " ";

        const bool isUrl = std::strstr(values[i], "://") != nullptr || std::strncmp(values[i], "urn:", 4) == 0;
        if (isUrl) text += "<";
        text += values[i];
        if (isUrl) text += ">";
        text += values[i + 1] ? " ,\n" : (endInDot ? " .\n\n" : " ;\n\n");
    }
}